

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool anon_unknown.dwarf_1b377::extract_tar
               (string *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,bool verbose,cmTarExtractTimestamps extractTimestamps,bool extract)

{
  pointer pbVar1;
  FILE *__stream;
  archive_entry *entry_00;
  bool bVar2;
  wchar_t wVar3;
  uint uVar4;
  mode_t mVar5;
  int iVar6;
  wchar_t wVar7;
  archive *a;
  archive *_a;
  archive *_a_00;
  Encoding *pEVar8;
  char *pcVar9;
  wstring *__s;
  la_int64_t lVar10;
  ulong uVar11;
  size_t sVar12;
  dev_t dVar13;
  dev_t dVar14;
  size_t sVar15;
  tm *__tp;
  la_ssize_t r;
  long *plVar16;
  size_type *psVar17;
  size_type *psVar18;
  undefined7 in_register_00000011;
  char *extraout_RDX;
  char *extraout_RDX_00;
  wchar_t *wcstr;
  wchar_t *wcstr_00;
  wchar_t *wcstr_01;
  wchar_t *wcstr_02;
  char *__format;
  pointer __rhs;
  archive_entry *entry;
  char tmp [100];
  size_t size;
  time_t tim;
  char *p;
  cmLocaleRAII localeRAII;
  allocator<char> local_121;
  archive_entry *local_120;
  wstring local_118 [3];
  string local_a8;
  archive *local_88;
  cmTarExtractTimestamps local_80;
  undefined4 local_7c;
  long *local_78 [2];
  long local_68 [2];
  char *local_58;
  cmLocaleRAII local_50;
  
  cmLocaleRAII::cmLocaleRAII(&local_50);
  a = archive_read_new();
  _a = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  _a_00 = archive_match_new();
  if (_a_00 == (archive *)0x0) {
    local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Out of memory","");
    cmSystemTools::Error((string *)local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
LAB_00115e6d:
      operator_delete(local_118[0]._M_dataplus._M_p,local_118[0].field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_7c = (undefined4)CONCAT71(in_register_00000011,verbose);
    pbVar1 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pcVar9 = extraout_RDX;
    local_80 = extractTimestamps;
    for (__rhs = (files->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
      wVar3 = archive_match_include_pattern(_a_00,(__rhs->_M_dataplus)._M_p);
      if (wVar3 != L'\0') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118,"Failed to add to inclusion list: ",__rhs);
        cmSystemTools::Error((string *)local_118);
        goto LAB_00115e68;
      }
      pcVar9 = extraout_RDX_00;
    }
    local_88 = _a_00;
    cmsys::Encoding::ToWide_abi_cxx11_(local_118,(Encoding *)(outFileName->_M_dataplus)._M_p,pcVar9)
    ;
    wVar3 = archive_read_open_filename_w(a,local_118[0]._M_dataplus._M_p,0x2800);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
      operator_delete(local_118[0]._M_dataplus._M_p,
                      local_118[0].field_2._M_allocated_capacity * 4 + 4);
    }
    if (wVar3 == L'\0') {
LAB_00115ea5:
      do {
        do {
          wVar3 = archive_read_next_header(a,&local_120);
          if (wVar3 != L'\0') {
            if (wVar3 != L'\x01') {
              ArchiveError("Problem with archive_read_next_header(): ",a);
            }
            goto LAB_001163fb;
          }
          wVar3 = archive_match_excluded(local_88,local_120);
          entry_00 = local_120;
          __stream = _stdout;
        } while (wVar3 != L'\0');
        if ((char)local_7c == '\0') {
          if (!extract) {
            pEVar8 = (Encoding *)archive_entry_pathname_w(local_120);
            cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_118,pEVar8,wcstr_00);
            cmSystemTools::Stdout((string *)local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
              operator_delete(local_118[0]._M_dataplus._M_p,
                              local_118[0].field_2._M_allocated_capacity + 1);
            }
            local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"\n","");
            cmSystemTools::Stdout((string *)local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
              operator_delete(local_118[0]._M_dataplus._M_p,
                              local_118[0].field_2._M_allocated_capacity + 1);
            }
            goto LAB_00115ea5;
          }
        }
        else {
          if (extract) {
            local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"x ","");
            cmSystemTools::Stdout((string *)local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
              operator_delete(local_118[0]._M_dataplus._M_p,
                              local_118[0].field_2._M_allocated_capacity + 1);
            }
            pEVar8 = (Encoding *)archive_entry_pathname_w(local_120);
            cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_118,pEVar8,wcstr);
            cmSystemTools::Stdout((string *)local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
              operator_delete(local_118[0]._M_dataplus._M_p,
                              local_118[0].field_2._M_allocated_capacity + 1);
            }
          }
          else {
            if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now == 0) {
              time(&(anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now);
            }
            pcVar9 = archive_entry_strmode((archive_entry_conflict *)entry_00);
            uVar4 = archive_entry_nlink(entry_00);
            fprintf(__stream,"%s %d ",pcVar9,(ulong)uVar4);
            __s = (wstring *)archive_entry_uname(entry_00);
            if ((__s == (wstring *)0x0) || (*(char *)&(__s->_M_dataplus)._M_p == '\0')) {
              lVar10 = archive_entry_uid(entry_00);
              snprintf((char *)local_118,100,"%lu ",lVar10);
              __s = local_118;
            }
            uVar11 = strlen((char *)__s);
            if (uVar11 < 7) {
              uVar11 = 6;
            }
            fprintf(__stream,"%-*s ",uVar11 & 0xffffffff,__s);
            pcVar9 = archive_entry_gname(entry_00);
            if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
              lVar10 = archive_entry_gid(entry_00);
              snprintf((char *)local_118,100,"%lu",lVar10);
              sVar12 = strlen((char *)local_118);
              fputs((char *)local_118,__stream);
            }
            else {
              fputs(pcVar9,__stream);
              sVar12 = strlen(pcVar9);
            }
            mVar5 = archive_entry_filetype(entry_00);
            if ((mVar5 == 0x2000) || (mVar5 = archive_entry_filetype(entry_00), mVar5 == 0x6000)) {
              dVar13 = archive_entry_rdevmajor(entry_00);
              dVar14 = archive_entry_rdevminor(entry_00);
              snprintf((char *)local_118,100,"%lu,%lu",dVar13,dVar14);
            }
            else {
              lVar10 = archive_entry_size(entry_00);
              snprintf((char *)local_118,100,"%lu",lVar10);
            }
            sVar15 = strlen((char *)local_118);
            iVar6 = (int)(sVar15 + sVar12) + 1;
            if (sVar15 + sVar12 < 0xd) {
              iVar6 = 0xd;
            }
            fprintf(__stream,"%*s",(ulong)(uint)(iVar6 - (int)sVar12),local_118);
            local_78[0] = (long *)archive_entry_mtime(entry_00);
            pcVar9 = "%e %b %H:%M";
            if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + 0xf099c0 <
                (long)local_78[0]) {
              pcVar9 = "%e %b  %Y";
            }
            if ((long)local_78[0] <
                (anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + -0xf099c0)
            {
              pcVar9 = "%e %b  %Y";
            }
            __tp = localtime((time_t *)local_78);
            strftime((char *)local_118,100,pcVar9,__tp);
            fprintf(__stream," %s ",local_118);
            pEVar8 = (Encoding *)archive_entry_pathname_w(entry_00);
            cmsys::Encoding::ToNarrow_abi_cxx11_(&local_a8,pEVar8,wcstr_01);
            fputs(local_a8._M_dataplus._M_p,__stream);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            pcVar9 = archive_entry_hardlink(entry_00);
            if (pcVar9 == (char *)0x0) {
              pcVar9 = archive_entry_symlink(entry_00);
              if (pcVar9 != (char *)0x0) {
                pcVar9 = archive_entry_symlink(entry_00);
                __format = " -> %s";
                goto LAB_001162b7;
              }
            }
            else {
              pcVar9 = archive_entry_hardlink(entry_00);
              __format = " link to %s";
LAB_001162b7:
              fprintf(__stream,__format,pcVar9);
            }
            fflush(__stream);
          }
          local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"\n","");
          cmSystemTools::Stdout((string *)local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
            operator_delete(local_118[0]._M_dataplus._M_p,
                            local_118[0].field_2._M_allocated_capacity + 1);
          }
          if (!extract) goto LAB_00115ea5;
        }
        if ((local_80 == Yes) &&
           (wVar3 = archive_write_disk_set_options(_a,L'\x04'), wVar3 != L'\0')) {
          ArchiveError("Problem with archive_write_disk_set_options(): ",_a);
          goto LAB_001163fb;
        }
        wVar3 = archive_write_header(_a,local_120);
        if (wVar3 != L'\0') {
          ArchiveError("Problem with archive_write_header(): ",_a);
          pEVar8 = (Encoding *)archive_entry_pathname_w(local_120);
          cmsys::Encoding::ToNarrow_abi_cxx11_(&local_a8,pEVar8,wcstr_02);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118,"Current file: ",&local_a8);
          cmSystemTools::Error((string *)local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
            operator_delete(local_118[0]._M_dataplus._M_p,
                            local_118[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001163fb;
        }
LAB_0011635f:
        iVar6 = archive_read_data_block
                          (a,(void **)local_118,(size_t *)&local_a8,(la_int64_t *)local_78);
        if (iVar6 != 1) {
          bVar2 = la_diagnostic(a,(long)iVar6);
          if (bVar2) goto code_r0x00116388;
          goto LAB_001163e1;
        }
        wVar3 = archive_write_finish_entry(_a);
        if (wVar3 != L'\0') goto LAB_001163ce;
      } while( true );
    }
    ArchiveError("Problem with archive_read_open_file(): ",a);
    archive_write_free(_a);
    archive_read_close(a);
  }
  goto LAB_00115e7a;
code_r0x00116388:
  r = archive_write_data_block
                (_a,local_118[0]._M_dataplus._M_p,(size_t)local_a8._M_dataplus._M_p,
                 (la_int64_t)local_78[0]);
  bVar2 = la_diagnostic(a,r);
  if (!bVar2) {
LAB_001163e1:
    wVar3 = L'\0';
    goto LAB_001163fb;
  }
  goto LAB_0011635f;
LAB_001163ce:
  ArchiveError("Problem with archive_write_finish_entry(): ",_a);
LAB_001163fb:
  bVar2 = false;
  while (wVar7 = archive_match_path_unmatched_inclusions_next(local_88,&local_58), wVar7 == L'\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_78,local_58,&local_121);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x25ec8d);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    psVar17 = (size_type *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_a8.field_2._M_allocated_capacity = *psVar17;
      local_a8.field_2._8_8_ = plVar16[3];
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar17;
      local_a8._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_a8._M_string_length = plVar16[1];
    *plVar16 = (long)psVar17;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
    psVar18 = (size_type *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar18) {
      local_118[0].field_2._0_8_ = *psVar18;
      local_118[0].field_2._8_8_ = plVar16[3];
    }
    else {
      local_118[0].field_2._0_8_ = *psVar18;
      local_118[0]._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_118[0]._M_string_length = plVar16[1];
    *plVar16 = (long)psVar18;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    cmSystemTools::Error((string *)local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
      operator_delete(local_118[0]._M_dataplus._M_p,local_118[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    bVar2 = true;
  }
  if (!bVar2) {
    if (wVar7 != L'\xffffffe2') {
      archive_match_free(local_88);
      archive_write_free(_a);
      archive_read_close(a);
      archive_read_free(a);
      bVar2 = (uint)wVar3 < 2;
      goto LAB_00115e7c;
    }
    local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"tar: Out of memory","");
    cmSystemTools::Error((string *)local_118);
LAB_00115e68:
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) goto LAB_00115e6d;
  }
LAB_00115e7a:
  bVar2 = false;
LAB_00115e7c:
  cmLocaleRAII::~cmLocaleRAII(&local_50);
  return bVar2;
}

Assistant:

bool extract_tar(const std::string& outFileName,
                 const std::vector<std::string>& files, bool verbose,
                 cmSystemTools::cmTarExtractTimestamps extractTimestamps,
                 bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive* ext = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  struct archive_entry* entry;

  struct archive* matching = archive_match_new();
  if (matching == nullptr) {
    cmSystemTools::Error("Out of memory");
    return false;
  }

  for (const auto& filename : files) {
    if (archive_match_include_pattern(matching, filename.c_str()) !=
        ARCHIVE_OK) {
      cmSystemTools::Error("Failed to add to inclusion list: " + filename);
      return false;
    }
  }

  int r = cm_archive_read_open_file(a, outFileName.c_str(), 10240);
  if (r) {
    ArchiveError("Problem with archive_read_open_file(): ", a);
    archive_write_free(ext);
    archive_read_close(a);
    return false;
  }
  for (;;) {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF) {
      break;
    }
    if (r != ARCHIVE_OK) {
      ArchiveError("Problem with archive_read_next_header(): ", a);
      break;
    }

    if (archive_match_excluded(matching, entry)) {
      continue;
    }

    if (verbose) {
      if (extract) {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      } else {
        list_item_verbose(stdout, entry);
      }
      cmSystemTools::Stdout("\n");
    } else if (!extract) {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      cmSystemTools::Stdout("\n");
    }
    if (extract) {
      if (extractTimestamps == cmSystemTools::cmTarExtractTimestamps::Yes) {
        r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
        if (r != ARCHIVE_OK) {
          ArchiveError("Problem with archive_write_disk_set_options(): ", ext);
          break;
        }
      }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK) {
        if (!copy_data(a, ext)) {
          break;
        }
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK) {
          ArchiveError("Problem with archive_write_finish_entry(): ", ext);
          break;
        }
      }
#  ifdef _WIN32
      else if (const char* linktext = archive_entry_symlink(entry)) {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry) << "\" -> \"" << linktext
                  << "\"." << std::endl;
      }
#  endif
      else {
        ArchiveError("Problem with archive_write_header(): ", ext);
        cmSystemTools::Error("Current file: " +
                             cm_archive_entry_pathname(entry));
        break;
      }
    }
  }